

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker3F1S.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int port;
  WorkerFlow *this;
  WorkerCallback *this_00;
  undefined8 extraout_RAX;
  size_t i;
  allocator<char> local_24d;
  int local_24c;
  WorkerStream ws;
  string flow_name;
  string flow_connect;
  JSONObject flow_config;
  JSONElement local_1b8;
  JSONObject config;
  string default_connect;
  string local_168;
  string config_file;
  string local_128;
  string filename;
  JSONParser parser;
  JSONArray flows_config;
  string local_90;
  string local_70;
  string local_50;
  
  if (argc == 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&config_file,argv[1],(allocator<char> *)&parser);
    JSONParser::JSONParser(&parser);
    std::__cxx11::string::string((string *)&local_168,(string *)&config_file);
    JSONParser::load_file(&parser,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    JSONParser::parse((JSONElement *)&ws,&parser);
    JSONElement::operator_cast_to_JSONObject(&config,(JSONElement *)&ws);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ws,"bind",(allocator<char> *)&flow_connect);
    JSONObject::operator[]((JSONElement *)&flow_name,&config,(string *)&ws);
    JSONElement::operator_cast_to_string(&default_connect,(JSONElement *)&flow_name);
    std::__cxx11::string::~string((string *)&ws);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ws,"flows",(allocator<char> *)&flow_connect);
    JSONObject::operator[]((JSONElement *)&flow_name,&config,(string *)&ws);
    JSONElement::operator_cast_to_JSONArray(&flows_config,(JSONElement *)&flow_name);
    std::__cxx11::string::~string((string *)&ws);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ws,"buffsize",(allocator<char> *)&flow_connect);
    JSONObject::operator[]((JSONElement *)&flow_name,&config,(string *)&ws);
    local_24c = JSONElement::operator_cast_to_int((JSONElement *)&flow_name);
    std::__cxx11::string::~string((string *)&ws);
    ws.m_flows._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &ws.m_flows._M_t._M_impl.super__Rb_tree_header._M_header;
    ws.m_flows._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    ws.m_flows._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    ws.m_flows._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    ws.m_flows._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         ws.m_flows._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (i = 0; i != 3; i = i + 1) {
      JSONArray::operator[]((JSONElement *)&flow_name,&flows_config,i);
      JSONElement::operator_cast_to_JSONObject(&flow_config,(JSONElement *)&flow_name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&flow_connect,"name",(allocator<char> *)&local_50);
      JSONObject::operator[]((JSONElement *)&filename,&flow_config,&flow_connect);
      JSONElement::operator_cast_to_string(&flow_name,(JSONElement *)&filename);
      std::__cxx11::string::~string((string *)&flow_connect);
      std::__cxx11::string::string((string *)&flow_connect,(string *)&default_connect);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"bind",&local_24d);
      JSONObject::operator[](&local_1b8,&flow_config,&local_50);
      JSONElement::operator_cast_to_string(&filename,&local_1b8);
      std::__cxx11::string::operator=((string *)&flow_connect,(string *)&filename);
      std::__cxx11::string::~string((string *)&filename);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&filename,"buffsize",(allocator<char> *)&local_1b8);
      JSONObject::operator[]((JSONElement *)&local_50,&flow_config,&filename);
      iVar1 = JSONElement::operator_cast_to_int((JSONElement *)&local_50);
      std::__cxx11::string::~string((string *)&filename);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&filename,"port",(allocator<char> *)&local_1b8);
      JSONObject::operator[]((JSONElement *)&local_50,&flow_config,&filename);
      port = JSONElement::operator_cast_to_int((JSONElement *)&local_50);
      std::__cxx11::string::~string((string *)&filename);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"file",&local_24d);
      JSONObject::operator[](&local_1b8,&flow_config,&local_50);
      JSONElement::operator_cast_to_string(&filename,&local_1b8);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string((string *)&local_128,(string *)&flow_name);
      std::__cxx11::string::string((string *)&local_70,(string *)&flow_connect);
      this = WorkerStream::create_flow(&ws,&local_128,&local_70,port,(long)iVar1);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_128);
      this_00 = (WorkerCallback *)operator_new(0x10);
      std::__cxx11::string::string((string *)&local_90,(string *)&filename);
      WorkerCallback::WorkerCallback(this_00,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      WorkerFlow::set_callback(this,(Callback *)this_00);
      WorkerFlow::own_callback(this);
      std::__cxx11::string::_M_assign((string *)&filename);
      std::__cxx11::string::~string((string *)&filename);
      std::__cxx11::string::~string((string *)&flow_connect);
      std::__cxx11::string::~string((string *)&flow_name);
    }
    WorkerStream::start(&ws);
    WorkerStream::~WorkerStream(&ws);
    std::__cxx11::string::~string((string *)&default_connect);
    JSONParser::~JSONParser(&parser);
    std::__cxx11::string::~string((string *)&config_file);
    return 0;
  }
  usage(argv);
  std::__cxx11::string::~string((string *)&flow_connect);
  std::__cxx11::string::~string((string *)&flow_name);
  WorkerStream::~WorkerStream(&ws);
  std::__cxx11::string::~string((string *)&default_connect);
  JSONParser::~JSONParser(&parser);
  std::__cxx11::string::~string((string *)&config_file);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main(int argc, char **argv)
{
    size_t buffsize = 2048;

    if (argc != 2) {
        usage(argv);
    }
    std::string config_file(argv[1]);

    // Parse config file (assume it has no errors)
    JSONParser parser;
    parser.load_file(config_file);
    JSONObject config = parser.parse();

    // REQUIRED: default connect
    std::string default_connect = config["bind"];
    JSONArray flows_config = config["flows"];
    try {
        buffsize = (int)config["buffsize"];
    } catch (JSMNUtilsEx &ex) {
        // buffsize stays default
    }
    // Initialize WorkerStream
    WorkerStream ws;

    for (int i = 0; i < N_THREADS; i++) {
        JSONObject flow_config = flows_config[i];
        std::string flow_name = flow_config["name"];
        std::string flow_connect = default_connect;
        int flow_buffsize = buffsize;
        try {
            flow_connect = (std::string)flow_config["bind"];
        } catch (JSMNUtilsEx &ex) {
            // bind stays default
        }
        try {
            flow_buffsize = (int)flow_config["buffsize"];
        } catch (JSMNUtilsEx &ex) {
            // buffsize stays default
        }
        int flow_port = flow_config["port"];
        //std::stringstream ss;
        //ss << flow_connect << ":" << flow_port;
        //flow_connect = ss.str(); // something like "tcp://localhost:5000"
        std::string filename = flow_config["file"];
        // Create flow
        WorkerFlow *flow = ws.create_flow(flow_name, flow_connect, flow_port,
                flow_buffsize);
        WorkerCallback *cb = new WorkerCallback(filename);
        flow->set_callback(cb);
        flow->own_callback(); // take care of it
        filename = filename;
        buffsize = buffsize;
    }

    // call the start method to loop workers.
    ws.start();
}